

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O2

void __thiscall icu_63::RBBIRuleScanner::error(RBBIRuleScanner *this,UErrorCode e)

{
  RBBIRuleBuilder *pRVar1;
  UErrorCode *pUVar2;
  UParseError *pUVar3;
  int32_t iVar4;
  
  pRVar1 = this->fRB;
  pUVar2 = pRVar1->fStatus;
  if (*pUVar2 < U_ILLEGAL_ARGUMENT_ERROR) {
    *pUVar2 = e;
    pUVar3 = pRVar1->fParseError;
    if (pUVar3 != (UParseError *)0x0) {
      iVar4 = this->fCharNum;
      pUVar3->line = this->fLineNum;
      pUVar3->offset = iVar4;
      pUVar3->preContext[0] = L'\0';
      pUVar3->postContext[0] = L'\0';
      return;
    }
  }
  return;
}

Assistant:

void RBBIRuleScanner::error(UErrorCode e) {
    if (U_SUCCESS(*fRB->fStatus)) {
        *fRB->fStatus = e;
        if (fRB->fParseError) {
            fRB->fParseError->line  = fLineNum;
            fRB->fParseError->offset = fCharNum;
            fRB->fParseError->preContext[0] = 0;
            fRB->fParseError->postContext[0] = 0;
        }
    }
}